

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

void __thiscall diy::Bounds<double>::Bounds(Bounds<double> *this,int dim)

{
  allocator<double> local_29;
  double local_28;
  
  local_28 = 0.0;
  itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::small_vector
            ((small_vector<double,_4UL,_0UL,_std::allocator<double>_> *)this,(long)dim,&local_28,
             &local_29);
  local_28 = 0.0;
  itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::small_vector
            (&(this->max).super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>,(long)dim,
             &local_28,&local_29);
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}